

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.h
# Opt level: O2

void __thiscall
google::protobuf::internal::InternalMetadataWithArena::DoSwap
          (InternalMetadataWithArena *this,UnknownFieldSet *other)

{
  void *pvVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  UnknownFieldSet *pUVar3;
  
  pvVar1 = (this->
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           ).ptr_;
  if (((ulong)pvVar1 & 1) == 0) {
    pUVar3 = InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ::mutable_unknown_fields_slow
                       (&this->
                         super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                       );
  }
  else {
    pUVar3 = (UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe);
  }
  pvVar2 = pUVar3->fields_;
  pUVar3->fields_ = other->fields_;
  other->fields_ = pvVar2;
  return;
}

Assistant:

void DoSwap(UnknownFieldSet* other) {
    mutable_unknown_fields()->Swap(other);
  }